

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

bool __thiscall
FOptionMenuTextField::MenuEvent(FOptionMenuTextField *this,int mkey,bool fromcontroller)

{
  FBaseCVar *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DTextEnterMenu *this_00;
  BYTE *__src;
  FSoundID local_1c;
  
  if (mkey != 0xb) {
    if (mkey != 10) {
      if (mkey == 6) {
        local_1c.ID = S_FindSound("menu/choose");
        S_Sound(0x22,&local_1c,snd_menuvolume.Value,0.0);
        pFVar1 = (this->super_FOptionMenuFieldBase).mCVar;
        if (pFVar1 == (FBaseCVar *)0x0) {
          __src = "";
        }
        else {
          iVar3 = (*pFVar1->_vptr_FBaseCVar[3])(pFVar1,0xffffffff);
          __src = (BYTE *)CONCAT44(extraout_var,iVar3);
        }
        strcpy(this->mEditName,(char *)__src);
        this->mEntering = true;
        this_00 = (DTextEnterMenu *)
                  M_Malloc_Dbg(0x58,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                               ,0x1f9);
        DTextEnterMenu::DTextEnterMenu
                  (this_00,DMenu::CurrentMenu,this->mEditName,0x80,2,fromcontroller,false);
        M_ActivateMenu((DMenu *)this_00);
        return true;
      }
      bVar2 = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
      return bVar2;
    }
    pFVar1 = (this->super_FOptionMenuFieldBase).mCVar;
    if (pFVar1 != (FBaseCVar *)0x0) {
      FBaseCVar::SetGenericRep(pFVar1,(UCVarValue)this->mEditName,CVAR_String);
    }
  }
  this->mEntering = false;
  return true;
}

Assistant:

bool MenuEvent ( int mkey, bool fromcontroller )
	{
		if ( mkey == MKEY_Enter )
		{
			S_Sound( CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE );
			strcpy( mEditName, GetCVarString() );
			mEntering = true;
			DMenu* input = new DTextEnterMenu ( DMenu::CurrentMenu, mEditName, sizeof mEditName, 2, fromcontroller );
			M_ActivateMenu( input );
			return true;
		}
		else if ( mkey == MKEY_Input )
		{
			if ( mCVar )
			{
				UCVarValue vval;
				vval.String = mEditName;
				mCVar->SetGenericRep( vval, CVAR_String );
			}

			mEntering = false;
			return true;
		}
		else if ( mkey == MKEY_Abort )
		{
			mEntering = false;
			return true;
		}

		return FOptionMenuItem::MenuEvent( mkey, fromcontroller );
	}